

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O1

void __thiscall avro::NodeUnion::printJson(NodeUnion *this,ostream *os,int depth)

{
  pointer psVar1;
  long *plVar2;
  undefined4 in_register_00000014;
  indent x;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  char local_3a [2];
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000014,depth);
  std::__ostream_insert<char,std::char_traits<char>>(os,"[\n",2);
  uVar5 = (uint)((ulong)((long)(this->super_NodeImplUnion).leafAttributes_.attrs_.
                               super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->super_NodeImplUnion).leafAttributes_.attrs_.
                              super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (0 < (int)uVar5) {
    x.d = (int)local_38 + 1;
    lVar4 = 0;
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,",\n",2);
      }
      operator<<(os,x);
      psVar1 = (this->super_NodeImplUnion).leafAttributes_.attrs_.
               super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->super_NodeImplUnion).leafAttributes_.attrs_.
                        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar3) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3
                  );
      }
      plVar2 = *(long **)((long)&psVar1->px + lVar4);
      (**(code **)(*plVar2 + 0x68))(plVar2,os,x.d);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x10;
    } while ((uVar5 & 0x7fffffff) != uVar3);
  }
  local_3a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(os,local_3a,1);
  operator<<(os,(indent)(int)local_38);
  local_3a[1] = 0x5d;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_3a + 1,1);
  return;
}

Assistant:

void 
NodeUnion::printJson(std::ostream &os, int depth) const
{
    os << "[\n";
    int fields = leafAttributes_.size();
    ++depth;
    for(int i = 0; i < fields; ++i) {
        if(i > 0) {
            os << ",\n";
        }
        os << indent(depth);
        leafAttributes_.get(i)->printJson(os, depth);
    }
    os << '\n';
    os << indent(--depth) << ']';
}